

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

StringRef __thiscall llvm::sys::path::remove_leading_dotslash(path *this,StringRef Path,Style style)

{
  StringRef SVar1;
  char cVar2;
  unsigned_long *puVar3;
  path *ppVar4;
  bool local_109;
  bool local_f1;
  undefined1 auStack_c8 [4];
  Style style_local;
  StringRef Path_local;
  unsigned_long local_98 [3];
  undefined1 *local_80;
  undefined1 local_78 [16];
  unsigned_long local_68 [3];
  undefined1 *local_50;
  undefined1 local_48 [16];
  char *local_38;
  path *local_30;
  undefined1 *local_28;
  char *local_20;
  path *local_18;
  undefined1 *local_10;
  
  Path_local.Data = Path.Data;
  _auStack_c8 = this;
  while( true ) {
    local_f1 = false;
    if ((char *)0x2 < Path_local.Data) {
      cVar2 = StringRef::operator[]((StringRef *)auStack_c8,0);
      local_f1 = false;
      if (cVar2 == '.') {
        cVar2 = StringRef::operator[]((StringRef *)auStack_c8,1);
        local_f1 = is_separator(cVar2,(Style)Path.Length);
      }
    }
    if (local_f1 == false) break;
    local_50 = auStack_c8;
    local_68[2] = 2;
    local_68[1] = 0xffffffffffffffff;
    puVar3 = std::min<unsigned_long>(local_68 + 2,(unsigned_long *)&Path_local);
    local_68[2] = *puVar3;
    ppVar4 = _auStack_c8 + local_68[2];
    local_68[0] = (long)Path_local.Data - local_68[2];
    puVar3 = std::min<unsigned_long>(local_68 + 1,local_68);
    Path_local.Data = (char *)*puVar3;
    local_28 = local_48;
    _auStack_c8 = ppVar4;
    local_38 = Path_local.Data;
    local_30 = ppVar4;
    while( true ) {
      local_109 = false;
      if (Path_local.Data != (char *)0x0) {
        cVar2 = StringRef::operator[]((StringRef *)auStack_c8,0);
        local_109 = is_separator(cVar2,(Style)Path.Length);
      }
      if (local_109 == false) break;
      local_80 = auStack_c8;
      local_98[2] = 1;
      local_98[1] = 0xffffffffffffffff;
      puVar3 = std::min<unsigned_long>(local_98 + 2,(unsigned_long *)&Path_local);
      local_98[2] = *puVar3;
      ppVar4 = _auStack_c8 + local_98[2];
      local_98[0] = (long)Path_local.Data - local_98[2];
      puVar3 = std::min<unsigned_long>(local_98 + 1,local_98);
      Path_local.Data = (char *)*puVar3;
      local_10 = local_78;
      _auStack_c8 = ppVar4;
      local_20 = Path_local.Data;
      local_18 = ppVar4;
    }
  }
  SVar1.Length = (size_t)Path_local.Data;
  SVar1.Data = (char *)_auStack_c8;
  return SVar1;
}

Assistant:

StringRef remove_leading_dotslash(StringRef Path, Style style) {
  // Remove leading "./" (or ".//" or "././" etc.)
  while (Path.size() > 2 && Path[0] == '.' && is_separator(Path[1], style)) {
    Path = Path.substr(2);
    while (Path.size() > 0 && is_separator(Path[0], style))
      Path = Path.substr(1);
  }
  return Path;
}